

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O3

int __thiscall
booster::
sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::compare(sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *other)

{
  ulong uVar1;
  undefined1 *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  ulong local_38;
  undefined1 local_30 [16];
  
  if (this->matched == true) {
    local_60 = local_50;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_60,
               (this->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current,
               (this->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).second._M_current);
  }
  else {
    local_60 = local_50;
    local_58 = 0;
    local_50[0] = 0;
  }
  if (other->matched == true) {
    local_40 = local_30;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_40,
               (other->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current,
               (other->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).second._M_current);
  }
  else {
    local_40 = local_30;
    local_38 = 0;
    local_30[0] = 0;
  }
  uVar3 = local_38;
  puVar2 = local_40;
  uVar1 = local_58;
  uVar5 = local_58;
  if (local_38 < local_58) {
    uVar5 = local_38;
  }
  if (uVar5 != 0) {
    uVar4 = memcmp(local_60,local_40,uVar5);
    uVar5 = (ulong)uVar4;
    if (uVar4 != 0) goto LAB_00111d9a;
  }
  uVar5 = 0xffffffff80000000;
  if (-0x80000000 < (long)(uVar1 - uVar3)) {
    uVar5 = uVar1 - uVar3;
  }
  if (0x7ffffffe < (long)uVar5) {
    uVar5 = 0x7fffffff;
  }
LAB_00111d9a:
  if (puVar2 != local_30) {
    operator_delete(puVar2);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return (int)uVar5;
}

Assistant:

int compare(sub_match const &other) const
		{
			return str().compare(other.str());
		}